

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryFlatUpdateLoop<duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,unsigned_long,duckdb::ModeFunction<duckdb::ModeStandard<unsigned_long>>>
               (unsigned_long *idata,AggregateInputData *aggr_input_data,
               ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> *state,idx_t count,
               ValidityMask *mask)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  unsigned_long *puVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar4 = 0;
  uVar6 = 0;
  do {
    if (uVar4 == count + 0x3f >> 6) {
      return;
    }
    puVar5 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    if (puVar5 == (unsigned_long *)0x0) {
      uVar7 = uVar6 + 0x40;
      if (count <= uVar6 + 0x40) {
        uVar7 = count;
      }
LAB_00c088cc:
      puVar5 = idata + uVar6;
      for (; uVar2 = uVar6, uVar6 < uVar7; uVar6 = uVar6 + 1) {
        BaseModeFunction<duckdb::ModeStandard<unsigned_long>>::
        Execute<unsigned_long,duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,duckdb::ModeFunction<duckdb::ModeStandard<unsigned_long>>>
                  (state,puVar5,aggr_input_data);
        puVar5 = puVar5 + 1;
      }
    }
    else {
      uVar1 = puVar5[uVar4];
      uVar7 = uVar6 + 0x40;
      if (count <= uVar6 + 0x40) {
        uVar7 = count;
      }
      if (uVar1 == 0xffffffffffffffff) goto LAB_00c088cc;
      uVar2 = uVar7;
      if (uVar1 != 0) {
        puVar5 = idata + uVar6;
        for (uVar3 = 0; uVar2 = uVar3 + uVar6, uVar3 + uVar6 < uVar7; uVar3 = uVar3 + 1) {
          if ((uVar1 >> (uVar3 & 0x3f) & 1) != 0) {
            BaseModeFunction<duckdb::ModeStandard<unsigned_long>>::
            Execute<unsigned_long,duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,duckdb::ModeFunction<duckdb::ModeStandard<unsigned_long>>>
                      (state,puVar5,aggr_input_data);
          }
          puVar5 = puVar5 + 1;
        }
      }
    }
    uVar4 = uVar4 + 1;
    uVar6 = uVar2;
  } while( true );
}

Assistant:

static inline void UnaryFlatUpdateLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                       STATE_TYPE *__restrict state, idx_t count, ValidityMask &mask) {
		AggregateUnaryInput input(aggr_input_data, mask);
		auto &base_idx = input.input_idx;
		base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (!OP::IgnoreNull() || ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[base_idx], input);
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[base_idx], input);
					}
				}
			}
		}
	}